

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# least.cpp
# Opt level: O1

void duckdb::LeastGreatestFunction<int,duckdb::LessThan,duckdb::StandardLeastGreatest<false>>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  int iVar1;
  data_ptr_t pdVar2;
  unsigned_long *puVar3;
  idx_t iVar4;
  sel_t *psVar5;
  reference pvVar6;
  VectorType vector_type_p;
  idx_t iVar7;
  idx_t iVar8;
  size_type sVar9;
  UnifiedVectorFormat vdata;
  bool result_has_value [2048];
  UnifiedVectorFormat local_880;
  bool local_838 [2056];
  
  if ((long)(args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
            super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
            super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
            super__Vector_impl_data._M_start == 0x68) {
    pvVar6 = vector<duckdb::Vector,_true>::operator[](&args->data,0);
    Vector::Reference(result,pvVar6);
    return;
  }
  vector_type_p = CONSTANT_VECTOR;
  if ((args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_start) {
    sVar9 = 0;
    vector_type_p = CONSTANT_VECTOR;
    do {
      pvVar6 = vector<duckdb::Vector,_true>::operator[](&args->data,sVar9);
      if (pvVar6->vector_type != CONSTANT_VECTOR) {
        vector_type_p = FLAT_VECTOR;
      }
      sVar9 = sVar9 + 1;
    } while (sVar9 < (ulong)(((long)(args->data).
                                    super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                    super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(args->data).
                                    super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                    super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3) *
                            0x4ec4ec4ec4ec4ec5));
  }
  pdVar2 = result->data;
  switchD_01306cb1::default(local_838,0,0x800);
  if ((args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_start) {
    sVar9 = 0;
    do {
      pvVar6 = vector<duckdb::Vector,_true>::operator[](&args->data,sVar9);
      if (pvVar6->vector_type == CONSTANT_VECTOR) {
        pvVar6 = vector<duckdb::Vector,_true>::operator[](&args->data,sVar9);
        puVar3 = (pvVar6->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar3 == (unsigned_long *)0x0) || ((*puVar3 & 1) != 0)) goto LAB_01bbd588;
      }
      else {
LAB_01bbd588:
        UnifiedVectorFormat::UnifiedVectorFormat(&local_880);
        pvVar6 = vector<duckdb::Vector,_true>::operator[](&args->data,sVar9);
        Vector::ToUnifiedFormat(pvVar6,args->count,&local_880);
        iVar4 = args->count;
        if (local_880.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          if (iVar4 != 0) {
            psVar5 = (local_880.sel)->sel_vector;
            iVar7 = 0;
            do {
              iVar8 = iVar7;
              if (psVar5 != (sel_t *)0x0) {
                iVar8 = (idx_t)psVar5[iVar7];
              }
              iVar1 = *(int *)(local_880.data + iVar8 * 4);
              if ((local_838[iVar7] != true) || (iVar1 < *(int *)(pdVar2 + iVar7 * 4))) {
                local_838[iVar7] = true;
                *(int *)(pdVar2 + iVar7 * 4) = iVar1;
              }
              iVar7 = iVar7 + 1;
            } while (iVar4 != iVar7);
          }
        }
        else if (iVar4 != 0) {
          psVar5 = (local_880.sel)->sel_vector;
          iVar7 = 0;
          do {
            iVar8 = iVar7;
            if (psVar5 != (sel_t *)0x0) {
              iVar8 = (idx_t)psVar5[iVar7];
            }
            if (((local_880.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                  [iVar8 >> 6] >> (iVar8 & 0x3f) & 1) != 0) &&
               ((iVar1 = *(int *)(local_880.data + iVar8 * 4), local_838[iVar7] != true ||
                (iVar1 < *(int *)(pdVar2 + iVar7 * 4))))) {
              local_838[iVar7] = true;
              *(int *)(pdVar2 + iVar7 * 4) = iVar1;
            }
            iVar7 = iVar7 + 1;
          } while (iVar4 != iVar7);
        }
        if (local_880.owned_sel.selection_data.internal.
            super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_880.owned_sel.selection_data.internal.
                     super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (local_880.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_880.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                     internal.
                     super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
      }
      sVar9 = sVar9 + 1;
    } while (sVar9 < (ulong)(((long)(args->data).
                                    super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                    super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(args->data).
                                    super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                    super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3) *
                            0x4ec4ec4ec4ec4ec5));
  }
  StandardLeastGreatest<false>::FinalizeResult(args->count,local_838,result,state);
  Vector::SetVectorType(result,vector_type_p);
  return;
}

Assistant:

static void LeastGreatestFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	if (args.ColumnCount() == 1) {
		// single input: nop
		result.Reference(args.data[0]);
		return;
	}
	auto &input = BASE_OP::Prepare(args, state);
	auto &result_vector = BASE_OP::TargetVector(result, state);

	auto result_type = VectorType::CONSTANT_VECTOR;
	for (idx_t col_idx = 0; col_idx < input.ColumnCount(); col_idx++) {
		if (args.data[col_idx].GetVectorType() != VectorType::CONSTANT_VECTOR) {
			// non-constant input: result is not a constant vector
			result_type = VectorType::FLAT_VECTOR;
		}
		if (BASE_OP::IS_STRING) {
			// for string vectors we add a reference to the heap of the children
			StringVector::AddHeapReference(result_vector, input.data[col_idx]);
		}
	}

	auto result_data = FlatVector::GetData<T>(result_vector);
	bool result_has_value[STANDARD_VECTOR_SIZE] {false};
	// perform the operation column-by-column
	for (idx_t col_idx = 0; col_idx < input.ColumnCount(); col_idx++) {
		if (input.data[col_idx].GetVectorType() == VectorType::CONSTANT_VECTOR &&
		    ConstantVector::IsNull(input.data[col_idx])) {
			// ignore null vector
			continue;
		}

		UnifiedVectorFormat vdata;
		input.data[col_idx].ToUnifiedFormat(input.size(), vdata);

		auto input_data = UnifiedVectorFormat::GetData<T>(vdata);
		if (!vdata.validity.AllValid()) {
			// potential new null entries: have to check the null mask
			for (idx_t i = 0; i < input.size(); i++) {
				auto vindex = vdata.sel->get_index(i);
				if (vdata.validity.RowIsValid(vindex)) {
					// not a null entry: perform the operation and add to new set
					auto ivalue = input_data[vindex];
					if (!result_has_value[i] || OP::template Operation<T>(ivalue, result_data[i])) {
						result_has_value[i] = true;
						result_data[i] = ivalue;
					}
				}
			}
		} else {
			// no new null entries: only need to perform the operation
			for (idx_t i = 0; i < input.size(); i++) {
				auto vindex = vdata.sel->get_index(i);

				auto ivalue = input_data[vindex];
				if (!result_has_value[i] || OP::template Operation<T>(ivalue, result_data[i])) {
					result_has_value[i] = true;
					result_data[i] = ivalue;
				}
			}
		}
	}
	BASE_OP::FinalizeResult(input.size(), result_has_value, result, state);
	result.SetVectorType(result_type);
}